

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

Vec_Vec_t * Vec_VecDupInt(Vec_Vec_t *p)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *Entry;
  long lVar1;
  
  p_00 = Vec_PtrAlloc(p->nSize);
  for (lVar1 = 0; lVar1 < p->nSize; lVar1 = lVar1 + 1) {
    Entry = Vec_IntDup((Vec_Int_t *)p->pArray[lVar1]);
    Vec_PtrPush(p_00,Entry);
  }
  return (Vec_Vec_t *)p_00;
}

Assistant:

static inline Vec_Vec_t * Vec_VecDupInt( Vec_Vec_t * p )
{
    Vec_Ptr_t * vNew;
    Vec_Int_t * vVec;
    int i;
    vNew = Vec_PtrAlloc( Vec_VecSize(p) );
    Vec_VecForEachLevelInt( p, vVec, i )
        Vec_PtrPush( vNew, Vec_IntDup(vVec) );
    return (Vec_Vec_t *)vNew;
}